

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunCommands.cpp
# Opt level: O2

ResponseLine * __thiscall
ResolveGenericCommand::trigger(ResolveGenericCommand *this,string_view parameters)

{
  size_t sVar1;
  char *pcVar2;
  bool bVar3;
  ResponseLine *pRVar4;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  basic_string_view<char,_std::char_traits<char>_> rhs_01;
  allocator<char> local_79;
  basic_string_view<char,_std::char_traits<char>_> local_78 [2];
  basic_string_view<char,_std::char_traits<char>_> local_58 [2];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  
  local_58[0]._M_str = parameters._M_str;
  local_58[0]._M_len = parameters._M_len;
  local_78[0]._M_len = 2;
  local_78[0]._M_str = " \t";
  jessilib::
  word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            (&command_split,local_58,local_78);
  if (command_split.second._M_len == 0) {
    pRVar4 = (ResponseLine *)operator_new(0x30);
    Jupiter::GenericCommand::ResponseLine::ResponseLine
              (pRVar4,0x42,"Error: Too few parameters. Syntax: resolve <hostname|ip> <address>",3);
  }
  else {
    rhs._M_str = "hostname";
    rhs._M_len = 8;
    bVar3 = jessilib::equalsi<char,char>(command_split.first,rhs);
    if ((!bVar3) &&
       (rhs_00._M_str = "host", rhs_00._M_len = 4,
       bVar3 = jessilib::equalsi<char,char>(command_split.first,rhs_00), !bVar3)) {
      rhs_01._M_str = "ip";
      rhs_01._M_len = 2;
      bVar3 = jessilib::equalsi<char,char>(command_split.first,rhs_01);
      if (!bVar3) {
        pRVar4 = (ResponseLine *)operator_new(0x30);
        Jupiter::GenericCommand::ResponseLine::ResponseLine
                  (pRVar4,0x45,
                   "Error: Invalid type. You can only resolve hostnames and IP addresses.",3);
        return pRVar4;
      }
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)local_78,&command_split.second,&local_79);
      Jupiter::Socket::resolveAddress_abi_cxx11_((char *)local_58,(uint)local_78[0]._M_len);
      pcVar2 = local_58[0]._M_str;
      sVar1 = local_58[0]._M_len;
      std::__cxx11::string::~string((string *)local_58);
      std::__cxx11::string::~string((string *)local_78);
      pRVar4 = (ResponseLine *)operator_new(0x30);
      if (pcVar2 != (char *)0x0) {
        Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar4,pcVar2,sVar1,0);
        return pRVar4;
      }
      Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar4,0x19,"Error: Unable to resolve.",2)
      ;
      return pRVar4;
    }
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)local_78,&command_split.second,&local_79);
    Jupiter::Socket::resolveHostname_abi_cxx11_((char *)local_58,(uint)local_78[0]._M_len);
    pcVar2 = local_58[0]._M_str;
    sVar1 = local_58[0]._M_len;
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)local_78);
    pRVar4 = (ResponseLine *)operator_new(0x30);
    if (pcVar2 == (char *)0x0) {
      Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar4,0x19,"Error: Unable to resolve.",2)
      ;
    }
    else {
      Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar4,pcVar2,sVar1,0);
    }
  }
  return pRVar4;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *ResolveGenericCommand::trigger(std::string_view parameters) {
	auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (command_split.second.empty()) {
		return new Jupiter::GenericCommand::ResponseLine("Error: Too few parameters. Syntax: resolve <hostname|ip> <address>"sv, GenericCommand::DisplayType::PrivateError);
	}

	std::string_view subcommand = command_split.first;
	if (jessilib::equalsi(subcommand, "hostname"sv)
		|| jessilib::equalsi(subcommand, "host"sv))
	{
		std::string_view resolved = Jupiter::Socket::resolveHostname(static_cast<std::string>(command_split.second).c_str(), 0);
		if (resolved.empty())
			return new Jupiter::GenericCommand::ResponseLine("Error: Unable to resolve."sv, GenericCommand::DisplayType::PublicError);
		return new Jupiter::GenericCommand::ResponseLine(resolved, GenericCommand::DisplayType::PublicSuccess);
	}
	else if (jessilib::equalsi(subcommand, "ip"sv))
	{
		std::string_view resolved = Jupiter::Socket::resolveAddress(static_cast<std::string>(command_split.second).c_str(), 0);
		if (resolved.empty())
			return new Jupiter::GenericCommand::ResponseLine("Error: Unable to resolve."sv, GenericCommand::DisplayType::PublicError);
		return new Jupiter::GenericCommand::ResponseLine(resolved, GenericCommand::DisplayType::PublicSuccess);
	}
	return new Jupiter::GenericCommand::ResponseLine("Error: Invalid type. You can only resolve hostnames and IP addresses."sv, GenericCommand::DisplayType::PrivateError);
}